

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int relocatePage(BtShared *pBt,MemPage *pDbPage,u8 eType,Pgno iPtrPage,Pgno iFreePage,int isCommit)

{
  u16 *puVar1;
  ushort uVar2;
  Pgno newPgno;
  Pager *pPager;
  PgHdr *pPg;
  int iVar3;
  DbPage *p;
  uint uVar4;
  Pgno PVar5;
  BtShared *pBt_00;
  MemPage *pPtrPage;
  int local_50;
  Pgno local_4c;
  MemPage *local_48;
  Pgno local_3c;
  BtShared *local_38;
  
  local_3c = pDbPage->pgno;
  pPager = pBt->pPager;
  pPg = pDbPage->pDbPage;
  local_38 = pBt;
  if ((pPager->tempFile == '\0') || (iVar3 = sqlite3PagerWrite(pPg), iVar3 == 0)) {
    uVar2 = pPg->flags;
    if ((uVar2 & 2) != 0) {
      iVar3 = subjournalPageIfRequired(pPg);
      if (iVar3 != 0) {
        return iVar3;
      }
      uVar2 = pPg->flags;
    }
    PVar5 = 0;
    if ((isCommit == 0) && ((uVar2 & 8) != 0)) {
      PVar5 = pPg->pgno;
    }
    pPg->flags = uVar2 & 0xfff7;
    local_4c = iPtrPage;
    p = sqlite3PagerLookup(pPager,iFreePage);
    if (p != (DbPage *)0x0) {
      pPg->flags = pPg->flags | p->flags & 8;
      if (pPager->tempFile == '\0') {
        sqlite3PcacheDrop(p);
      }
      else {
        sqlite3PcacheMove(p,pPager->dbSize + 1);
      }
    }
    newPgno = pPg->pgno;
    sqlite3PcacheMove(pPg,iFreePage);
    sqlite3PcacheMakeDirty(pPg);
    if ((p != (DbPage *)0x0) && (pPager->tempFile != '\0')) {
      sqlite3PcacheMove(p,newPgno);
      sqlite3PagerUnrefNotNull(p);
    }
    if (PVar5 != 0) {
      iVar3 = (*pPager->xGet)(pPager,PVar5,(DbPage **)&local_48,0);
      if (iVar3 != 0) {
        if (pPager->dbOrigSize < PVar5) {
          return iVar3;
        }
        sqlite3BitvecClear(pPager->pInJournal,PVar5,pPager->pTmpSpace);
        return iVar3;
      }
      puVar1 = (u16 *)((long)local_48->apOvfl + 0xc);
      *puVar1 = *puVar1 | 8;
      sqlite3PcacheMakeDirty((PgHdr *)local_48);
      sqlite3PagerUnrefNotNull((DbPage *)local_48);
    }
    pBt_00 = local_38;
    PVar5 = local_4c;
    local_50 = 0;
    pDbPage->pgno = iFreePage;
    if ((eType & 0xfb) == 1) {
      iVar3 = setChildPtrmaps(pDbPage);
      if (iVar3 != 0) {
        return iVar3;
      }
      pBt_00 = local_38;
      PVar5 = local_4c;
      if (eType == '\x01') {
        return 0;
      }
    }
    else {
      uVar4 = *(uint *)pDbPage->aData;
      uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      if ((uVar4 != 0) && (ptrmapPut(local_38,uVar4,'\x04',iFreePage,&local_50), local_50 != 0)) {
        return local_50;
      }
    }
    iVar3 = btreeGetPage(pBt_00,PVar5,&local_48,0);
    if (iVar3 == 0) {
      iVar3 = sqlite3PagerWrite(local_48->pDbPage);
      if (iVar3 == 0) {
        iVar3 = modifyPagePointer(local_48,local_3c,iFreePage,eType);
        local_50 = iVar3;
        sqlite3PagerUnrefNotNull(local_48->pDbPage);
        if (iVar3 == 0) {
          ptrmapPut(pBt_00,iFreePage,eType,PVar5,&local_50);
          iVar3 = local_50;
        }
      }
      else {
        sqlite3PagerUnrefNotNull(local_48->pDbPage);
      }
    }
  }
  return iVar3;
}

Assistant:

static int relocatePage(
  BtShared *pBt,           /* Btree */
  MemPage *pDbPage,        /* Open page to move */
  u8 eType,                /* Pointer map 'type' entry for pDbPage */
  Pgno iPtrPage,           /* Pointer map 'page-no' entry for pDbPage */
  Pgno iFreePage,          /* The location to move pDbPage to */
  int isCommit             /* isCommit flag passed to sqlite3PagerMovepage */
){
  MemPage *pPtrPage;   /* The page that contains a pointer to pDbPage */
  Pgno iDbPage = pDbPage->pgno;
  Pager *pPager = pBt->pPager;
  int rc;

  assert( eType==PTRMAP_OVERFLOW2 || eType==PTRMAP_OVERFLOW1 || 
      eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE );
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pDbPage->pBt==pBt );

  /* Move page iDbPage from its current location to page number iFreePage */
  TRACE(("AUTOVACUUM: Moving %d to free page %d (ptr page %d type %d)\n", 
      iDbPage, iFreePage, iPtrPage, eType));
  rc = sqlite3PagerMovepage(pPager, pDbPage->pDbPage, iFreePage, isCommit);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pDbPage->pgno = iFreePage;

  /* If pDbPage was a btree-page, then it may have child pages and/or cells
  ** that point to overflow pages. The pointer map entries for all these
  ** pages need to be changed.
  **
  ** If pDbPage is an overflow page, then the first 4 bytes may store a
  ** pointer to a subsequent overflow page. If this is the case, then
  ** the pointer map needs to be updated for the subsequent overflow page.
  */
  if( eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE ){
    rc = setChildPtrmaps(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }else{
    Pgno nextOvfl = get4byte(pDbPage->aData);
    if( nextOvfl!=0 ){
      ptrmapPut(pBt, nextOvfl, PTRMAP_OVERFLOW2, iFreePage, &rc);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  /* Fix the database pointer on page iPtrPage that pointed at iDbPage so
  ** that it points at iFreePage. Also fix the pointer map entry for
  ** iPtrPage.
  */
  if( eType!=PTRMAP_ROOTPAGE ){
    rc = btreeGetPage(pBt, iPtrPage, &pPtrPage, 0);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    rc = sqlite3PagerWrite(pPtrPage->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(pPtrPage);
      return rc;
    }
    rc = modifyPagePointer(pPtrPage, iDbPage, iFreePage, eType);
    releasePage(pPtrPage);
    if( rc==SQLITE_OK ){
      ptrmapPut(pBt, iFreePage, eType, iPtrPage, &rc);
    }
  }
  return rc;
}